

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

cgltf_result cgltf_parse(cgltf_options *options,void *data,cgltf_size size,cgltf_data **out_data)

{
  uint uVar1;
  uint *puVar2;
  cgltf_result json_result;
  uint32_t bin_length;
  uint8_t *bin_chunk;
  cgltf_size bin_size;
  void *bin;
  uint32_t json_length;
  uint8_t *json_chunk;
  uint32_t version;
  uint8_t *ptr;
  cgltf_result json_result_1;
  uint32_t tmp;
  cgltf_options fixed_options;
  cgltf_data **out_data_local;
  cgltf_size size_local;
  void *data_local;
  cgltf_options *options_local;
  
  if (size < 0xc) {
    options_local._4_4_ = cgltf_result_data_too_short;
  }
  else if (options == (cgltf_options *)0x0) {
    options_local._4_4_ = cgltf_result_invalid_options;
  }
  else {
    fixed_options.file.user_data = out_data;
    memcpy(&json_result_1,options,0x40);
    if (fixed_options.json_token_count == 0) {
      fixed_options.json_token_count = (cgltf_size)cgltf_default_alloc;
    }
    if (fixed_options.memory.alloc == (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
      fixed_options.memory.alloc = cgltf_default_free;
    }
    if (*data != 0x46546c67) {
      if (json_result_1 == cgltf_result_success) {
        json_result_1 = cgltf_result_data_too_short;
      }
      else if (json_result_1 == cgltf_result_unknown_format) {
        return cgltf_result_unknown_format;
      }
    }
    if (json_result_1 == cgltf_result_data_too_short) {
      options_local._4_4_ =
           cgltf_parse_json((cgltf_options *)&json_result_1,(uint8_t *)data,size,
                            (cgltf_data **)fixed_options.file.user_data);
      if (options_local._4_4_ == cgltf_result_success) {
        **fixed_options.file.user_data = 1;
        options_local._4_4_ = cgltf_result_success;
      }
    }
    else if (*(uint *)((long)data + 4) == 2) {
      if (size < *(uint *)((long)data + 8)) {
        options_local._4_4_ = cgltf_result_data_too_short;
      }
      else if (size < 0x14) {
        options_local._4_4_ = cgltf_result_data_too_short;
      }
      else {
        uVar1 = *(uint *)((long)data + 0xc);
        if (size < (ulong)uVar1 + 0x14) {
          options_local._4_4_ = cgltf_result_data_too_short;
        }
        else if (*(int *)((long)data + 0x10) == 0x4e4f534a) {
          bin_size = 0;
          bin_chunk = (uint8_t *)0x0;
          if ((ulong)uVar1 + 0x1c <= size) {
            puVar2 = (uint *)((uint8_t *)((long)data + 0x14) + uVar1);
            if (size < (ulong)uVar1 + 0x1c + (ulong)*puVar2) {
              return cgltf_result_data_too_short;
            }
            if (puVar2[1] != 0x4e4942) {
              return cgltf_result_unknown_format;
            }
            bin_size = (cgltf_size)(puVar2 + 2);
            bin_chunk = (uint8_t *)(ulong)*puVar2;
          }
          options_local._4_4_ =
               cgltf_parse_json((cgltf_options *)&json_result_1,(uint8_t *)((long)data + 0x14),
                                (ulong)uVar1,(cgltf_data **)fixed_options.file.user_data);
          if (options_local._4_4_ == cgltf_result_success) {
            **fixed_options.file.user_data = 2;
            *(cgltf_size *)(*fixed_options.file.user_data + 0x168) = bin_size;
            *(uint8_t **)(*fixed_options.file.user_data + 0x170) = bin_chunk;
            options_local._4_4_ = cgltf_result_success;
          }
        }
        else {
          options_local._4_4_ = cgltf_result_unknown_format;
        }
      }
    }
    else {
      options_local._4_4_ = cgltf_result_unknown_format;
      if (*(uint *)((long)data + 4) < 2) {
        options_local._4_4_ = cgltf_result_legacy_gltf;
      }
    }
  }
  return options_local._4_4_;
}

Assistant:

cgltf_result cgltf_parse(const cgltf_options* options, const void* data, cgltf_size size, cgltf_data** out_data)
{
    if (size < GlbHeaderSize)
    {
        return cgltf_result_data_too_short;
    }

    if (options == NULL)
    {
        return cgltf_result_invalid_options;
    }

    cgltf_options fixed_options = *options;
    if (fixed_options.memory.alloc == NULL)
    {
        fixed_options.memory.alloc = &cgltf_default_alloc;
    }
    if (fixed_options.memory.free == NULL)
    {
        fixed_options.memory.free = &cgltf_default_free;
    }

    uint32_t tmp;
    // Magic
    memcpy(&tmp, data, 4);
    if (tmp != GlbMagic)
    {
        if (fixed_options.type == cgltf_file_type_invalid)
        {
            fixed_options.type = cgltf_file_type_gltf;
        }
        else if (fixed_options.type == cgltf_file_type_glb)
        {
            return cgltf_result_unknown_format;
        }
    }

    if (fixed_options.type == cgltf_file_type_gltf)
    {
        cgltf_result json_result = cgltf_parse_json(&fixed_options, (const uint8_t*)data, size, out_data);
        if (json_result != cgltf_result_success)
        {
            return json_result;
        }

        (*out_data)->file_type = cgltf_file_type_gltf;

        return cgltf_result_success;
    }

    const uint8_t* ptr = (const uint8_t*)data;
    // Version
    memcpy(&tmp, ptr + 4, 4);
    uint32_t version = tmp;
    if (version != GlbVersion)
    {
        return version < GlbVersion ? cgltf_result_legacy_gltf : cgltf_result_unknown_format;
    }

    // Total length
    memcpy(&tmp, ptr + 8, 4);
    if (tmp > size)
    {
        return cgltf_result_data_too_short;
    }

    const uint8_t* json_chunk = ptr + GlbHeaderSize;

    if (GlbHeaderSize + GlbChunkHeaderSize > size)
    {
        return cgltf_result_data_too_short;
    }

    // JSON chunk: length
    uint32_t json_length;
    memcpy(&json_length, json_chunk, 4);
    if (GlbHeaderSize + GlbChunkHeaderSize + json_length > size)
    {
        return cgltf_result_data_too_short;
    }

    // JSON chunk: magic
    memcpy(&tmp, json_chunk + 4, 4);
    if (tmp != GlbMagicJsonChunk)
    {
        return cgltf_result_unknown_format;
    }

    json_chunk += GlbChunkHeaderSize;

    const void* bin = 0;
    cgltf_size bin_size = 0;

    if (GlbHeaderSize + GlbChunkHeaderSize + json_length + GlbChunkHeaderSize <= size)
    {
        // We can read another chunk
        const uint8_t* bin_chunk = json_chunk + json_length;

        // Bin chunk: length
        uint32_t bin_length;
        memcpy(&bin_length, bin_chunk, 4);
        if (GlbHeaderSize + GlbChunkHeaderSize + json_length + GlbChunkHeaderSize + bin_length > size)
        {
            return cgltf_result_data_too_short;
        }

        // Bin chunk: magic
        memcpy(&tmp, bin_chunk + 4, 4);
        if (tmp != GlbMagicBinChunk)
        {
            return cgltf_result_unknown_format;
        }

        bin_chunk += GlbChunkHeaderSize;

        bin = bin_chunk;
        bin_size = bin_length;
    }

    cgltf_result json_result = cgltf_parse_json(&fixed_options, json_chunk, json_length, out_data);
    if (json_result != cgltf_result_success)
    {
        return json_result;
    }

    (*out_data)->file_type = cgltf_file_type_glb;
    (*out_data)->bin = bin;
    (*out_data)->bin_size = bin_size;

    return cgltf_result_success;
}